

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O2

Literal_t * Rpo_Factorize(uint *target,int nVars,int nThreshold,int verbose)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  Literal_t **vecLit;
  Literal_t *pLVar4;
  int extraout_EDX;
  uint nLit;
  int nVars_00;
  uint *puVar5;
  ulong uVar6;
  int thresholdCount;
  ulong local_40;
  ulong local_38;
  
  thresholdCount = 0;
  puVar5 = target;
  iVar2 = Kit_TruthIsConst0(target,nVars);
  if (iVar2 == 0) {
    iVar2 = 1;
    uVar3 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
    if (nVars < 6) {
      uVar3 = 1;
    }
    while (0 < (int)uVar3) {
      lVar1 = uVar3 - 1;
      uVar3 = uVar3 - 1;
      if (target[lVar1] != 0xffffffff) {
        local_40 = (ulong)(uint)verbose;
        local_38 = (ulong)(uint)nThreshold;
        if (verbose != 0) {
          Abc_Print((int)puVar5,"Target: ");
          puVar5 = target;
          Lit_PrintTT(target,nVars);
          Abc_Print((int)puVar5,"\n");
        }
        puVar5 = (uint *)((long)(nVars * 2) << 3);
        vecLit = (Literal_t **)malloc((size_t)puVar5);
        nLit = 0;
        iVar2 = nVars;
        while (0 < iVar2) {
          iVar2 = iVar2 + -1;
          pLVar4 = Lit_Alloc(target,nVars,iVar2,'+');
          if (pLVar4 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar4;
            nLit = nLit + 1;
          }
          puVar5 = target;
          pLVar4 = Lit_Alloc(target,nVars,iVar2,'-');
          if (pLVar4 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar4;
            nLit = nLit + 1;
          }
        }
        if ((int)local_40 != 0) {
          Abc_Print((int)puVar5,"Allocated %d literal clusters\n",(ulong)nLit);
        }
        pLVar4 = Rpo_Recursion(target,vecLit,nLit,nLit,nVars,&thresholdCount,(int)local_38,
                               (int)local_40);
        uVar6 = 0;
        uVar3 = (ulong)nLit;
        if ((int)nLit < 1) {
          uVar3 = uVar6;
        }
        for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          Lit_Free(vecLit[uVar6]);
        }
        free(vecLit);
        return pLVar4;
      }
    }
    nVars_00 = 1;
  }
  else {
    nVars_00 = 0;
    iVar2 = extraout_EDX;
  }
  pLVar4 = Lit_CreateLiteralConst(target,nVars_00,iVar2);
  return pLVar4;
}

Assistant:

Literal_t* Rpo_Factorize(unsigned* target, int nVars, int nThreshold, int verbose) {

    int nLitCap = nVars * 2;
    int nLit = 0;
    int w;
    Literal_t** vecLit;
    Literal_t* lit;
    Literal_t* result;
    int thresholdCount = 0;

    if (Kit_TruthIsConst0(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 0);
    } else if (Kit_TruthIsConst1(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 1);
    }

    //    if (nThreshold == -1) {
    //        nThreshold = nLitCap + nVars;
    //    }
    if (verbose) {
        Abc_Print(-2, "Target: ");
        Lit_PrintTT(target, nVars);
        Abc_Print(-2, "\n");
    }
    vecLit = ABC_ALLOC(Literal_t*, nLitCap);

    for (w = nVars - 1; w >= 0; w--) {
        lit = Lit_Alloc(target, nVars, w, '+');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
        lit = Lit_Alloc(target, nVars, w, '-');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
    }
    if (verbose) {
        Abc_Print(-2, "Allocated %d literal clusters\n", nLit);
    }

    result = Rpo_Recursion(target, vecLit, nLit, nLit, nVars, &thresholdCount, nThreshold, verbose);

    //freeing the memory
    for (w = 0; w < nLit; ++w) {
        Lit_Free(vecLit[w]);
    }
    ABC_FREE(vecLit);

    return result;

}